

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int x86JMP(uchar *stream,uint labelID,bool isNear)

{
  UnsatisfiedJump *pUVar1;
  ulong uVar2;
  ulong uVar3;
  UnsatisfiedJump local_18;
  
  *stream = !isNear * '\x02' | 0xe9;
  local_18.labelID = labelID & 0x7fffffff;
  local_18.isNear = isNear;
  uVar3 = (ulong)pendingJumps.count;
  if (pendingJumps.count == pendingJumps.max) {
    local_18.jmpPos = stream;
    FastVector<UnsatisfiedJump,_false,_false>::grow_and_add
              (&pendingJumps,pendingJumps.count,&local_18);
  }
  else {
    pendingJumps.count = pendingJumps.count + 1;
    uVar2 = CONCAT44(local_18._4_4_,labelID) & 0xffffffff7fffffff;
    pUVar1 = pendingJumps.data + uVar3;
    pUVar1->labelID = (int)uVar2;
    pUVar1->isNear = (bool)(char)(uVar2 >> 0x20);
    *(int3 *)&pUVar1->field_0x5 = (int3)(uVar2 >> 0x28);
    pUVar1->jmpPos = stream;
  }
  return (uint)isNear + (uint)isNear * 2 + 2;
}

Assistant:

int x86JMP(unsigned char *stream, unsigned int labelID, bool isNear)
{
	labelID &= 0x7FFFFFFF;

	if(isNear)
		stream[0] = 0xE9;
	else
		stream[0] = 0xEB;

	pendingJumps.push_back(UnsatisfiedJump(labelID, isNear, stream));
	return (isNear ? 5 : 2);
}